

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int Saig_ManBmcTerSimCount01Po(Aig_Man_t *p,uint *pInfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  iVar1 = p->nTruePos;
  if ((long)iVar1 < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = p->vCos->nSize;
    lVar5 = 0;
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    iVar3 = 0;
    do {
      if (uVar4 <= iVar1 - 1U) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = *(int *)((long)p->vCos->pArray[lVar5] + 0x24);
      iVar3 = (iVar3 + 1) -
              (uint)((~(pInfo[iVar2 >> 4] >> ((char)iVar2 * '\x02' & 0x1fU)) & 3) == 0);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return iVar3;
}

Assistant:

int Saig_ManBmcTerSimCount01Po( Aig_Man_t * p, unsigned * pInfo )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachPo( p, pObj, i )
        Counter += (Saig_ManBmcSimInfoGet(pInfo, pObj) != SAIG_TER_UND);
    return Counter;
}